

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

int __thiscall CPU::instrAND0x2d(CPU *this)

{
  uint8_t argument;
  CPU *in_RDI;
  
  argument = absolute_addr(in_RDI);
  AND(in_RDI,argument);
  return 4;
}

Assistant:

int CPU::instrAND0x2d() {
	AND(absolute_addr());
	return 4;
}